

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

void __thiscall ODDLParser::OpenDDLParser::setLogCallback(OpenDDLParser *this,logCallback callback)

{
  logCallback callback_local;
  OpenDDLParser *this_local;
  
  if (callback == (logCallback)0x0) {
    this->m_logCallback = logMessage;
  }
  else {
    this->m_logCallback = callback;
  }
  return;
}

Assistant:

void OpenDDLParser::setLogCallback( logCallback callback ) {
    if( ddl_nullptr != callback ) {
        // install user-specific log callback
        m_logCallback = callback;
    } else {
        // install default log callback
        m_logCallback = &logMessage;
    }
}